

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall FileEntryInfo::serializeDir(FileEntryInfo *this)

{
  FileEntryInfo *pFVar1;
  pointer ppFVar2;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1;
  uint uVar3;
  FileEntryInfo **i;
  pointer ppFVar4;
  ByteFileWriter local_848;
  uint8_t buffer [2048];
  
  uVar3 = 0;
  memset(buffer,0,0x800);
  local_848.m_bufferEnd = &stack0xffffffffffffffd8;
  buffer._24_4_ =
       (int)((ulong)(this->m_owner->m_file).m_pos >> 0xb) - this->m_owner->m_tagLocationBaseAddr;
  buffer._12_4_ = buffer._24_4_ + 1;
  builtin_memcpy(buffer,"\x01\x01\x03",4);
  buffer[6] = '\x01';
  buffer[7] = '\0';
  buffer[0x10] = '\x01';
  buffer[0x11] = '\0';
  buffer[0x12] = '\n';
  buffer[0x13] = '\0';
  pFVar1 = this->m_parent;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    uVar3 = (uint)pFVar1->m_objectId;
    buffer._24_4_ = pFVar1->m_sectorNum;
  }
  local_848.m_curPos = buffer + 0x28;
  buffer[0x14] = '\0';
  buffer[0x15] = '\b';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x1c] = '\x01';
  buffer[0x1d] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  local_848.m_buffer = buffer;
  local_848.m_tagPos = buffer;
  buffer._32_4_ = uVar3;
  ByteFileWriter::closeDescriptorTag(&local_848,-1);
  ppFVar2 = (this->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (this->m_files).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar4 != ppFVar2; ppFVar4 = ppFVar4 + 1) {
    writeEntity(this,&local_848,*ppFVar4);
  }
  ppFVar2 = (this->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (this->m_subDirs).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar4 != ppFVar2; ppFVar4 = ppFVar4 + 1) {
    writeEntity(this,&local_848,*ppFVar4);
  }
  if ((long)local_848.m_curPos - (long)local_848.m_buffer < 0x800) {
    IsoWriter::writeExtendedFileEntryDescriptor
              (this->m_owner,false,this->m_objectId,this->m_fileType,
               (long)local_848.m_curPos - (long)local_848.m_buffer,this->m_sectorNum + 1,
               (short)((uint)(*(int *)&(this->m_subDirs).
                                       super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                             *(int *)&(this->m_subDirs).
                                      super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1,
               (ExtentList *)0x0);
    IsoWriter::writeSector(this->m_owner,buffer);
    return;
  }
  __assert_fail("writer.size() < SECTOR_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                ,0x1a8,"void FileEntryInfo::serializeDir() const");
}

Assistant:

void FileEntryInfo::serializeDir() const
{
    uint8_t buffer[SECTOR_SIZE] = {};

    ByteFileWriter writer;
    writer.setBuffer(buffer, sizeof(buffer));

    // ------------ 1 (parent entry) ---------------

    writer.writeDescriptorTag(DescriptorTag::FileId, m_owner->absoluteSectorNum() + 1);
    writer.writeLE16(0x01);  // File Version Number
    writer.writeLE8(0x0A);   // File Characteristics, parent flag (3-th bit) and  'directory' bit (1-th)
    writer.writeLE8(0x00);   // Length of File Identifier (=L_FI)

    const uint8_t parentId = m_parent ? m_parent->m_objectId : 0;
    writer.writeLongAD(0x800, m_parent ? m_parent->m_sectorNum : m_owner->absoluteSectorNum(), 0x01,
                       parentId);  // parent entry ICB
    writer.writeLE16(0);           // Length of Implementation Use
    writer.writeLE16(0);           // zero d-string for parent FID
    writer.closeDescriptorTag();

    // ------------ 2 (entries) ---------------
    for (const auto &i : m_files) writeEntity(writer, i);
    for (const auto &i : m_subDirs) writeEntity(writer, i);
    assert(writer.size() < SECTOR_SIZE);  // not supported

    m_owner->writeExtendedFileEntryDescriptor(false, m_objectId, m_fileType, writer.size(), m_sectorNum + 1,
                                              static_cast<uint16_t>(m_subDirs.size() + 1));
    m_owner->writeSector(buffer);
}